

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O0

ASTNode * ParseIf(Scope *scope,Lexer *lexer)

{
  Token tok_00;
  int iVar1;
  ASTNode *pAVar2;
  char *pcVar3;
  ASTNode *pAVar4;
  Token tok;
  ASTNode *ifExpr;
  Lexer *lexer_local;
  Scope *scope_local;
  
  pAVar2 = GetNextNode(scope);
  pAVar2->isStmt = true;
  pAVar2->type = IF;
  tok_00 = GetNextToken(lexer);
  if (tok_00 != LPAREN) {
    pcVar3 = TokenToString(tok_00);
    printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","LPAREN",pcVar3,
           (ulong)(uint)(lexer->tracker).row,
           (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
    exit(0);
  }
  pAVar4 = ParseExpression(scope,lexer);
  (pAVar2->meta).binaryExpr.left = pAVar4;
  iVar1 = ParseBody(scope,lexer);
  (pAVar2->meta).ifExpr.body = iVar1;
  return pAVar2;
}

Assistant:

ASTNode* ParseIf(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("If");
	TRACK();
	ASTNode* ifExpr = GetNextNode(scope);
	SET_IS_STMT(ifExpr);
	SET_NODE_TYPE(ifExpr, IF);

	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	SET_IF_CONDITION(ifExpr, ParseExpression(scope, lexer));
	SET_IF_BODY(ifExpr, ParseBody(scope, lexer));
	return ifExpr;
}